

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPrintNumStar(Vec_Str_t *p,int Num,int nDigits)

{
  char local_38 [8];
  char Digits [16];
  int local_1c;
  int local_18;
  int i;
  int nDigits_local;
  int Num_local;
  Vec_Str_t *p_local;
  
  memset(local_38,0,0x10);
  if (Num == 0) {
    for (local_1c = 0; local_1c < nDigits; local_1c = local_1c + 1) {
      Vec_StrPush(p,'0');
    }
  }
  else {
    local_18 = nDigits;
    i = Num;
    if (Num < 0) {
      Vec_StrPush(p,'-');
      i = -Num;
      local_18 = nDigits + -1;
    }
    local_1c = 0;
    for (; i != 0; i = i / 10) {
      local_38[local_1c] = (char)(i % 10);
      local_1c = local_1c + 1;
    }
    local_1c = Abc_MaxInt(local_1c,local_18);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      Vec_StrPush(p,local_38[local_1c] + '0');
    }
  }
  return;
}

Assistant:

static inline void Vec_StrPrintNumStar( Vec_Str_t * p, int Num, int nDigits )
{
    int i;
    char Digits[16] = {0};
    if ( Num == 0 )
    {
        for ( i = 0; i < nDigits; i++ )
            Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
        nDigits--;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i = Abc_MaxInt(i, nDigits)-1; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}